

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall USDFParser::Parse(USDFParser *this,int lumpnum,FileReader *lump,int lumplen)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  char *buffer;
  char *name;
  int iVar4;
  
  buffer = (char *)operator_new__((long)lumplen);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,buffer,(long)lumplen);
  name = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  FScanner::OpenMem((FScanner *)this,name,buffer,lumplen);
  operator_delete__(buffer);
  iVar4 = 1;
  FScanner::SetCMode((FScanner *)this,true);
  bVar2 = FScanner::CheckString((FScanner *)this,"namespace");
  if (bVar2) {
    FScanner::MustGetToken((FScanner *)this,0x3d);
    FScanner::MustGetToken((FScanner *)this,0x102);
    FName::operator=(&(this->super_UDMFParserBase).namespc,(this->super_UDMFParserBase).sc.String);
    iVar1 = (this->super_UDMFParserBase).namespc.Index;
    if (iVar1 != 0x18c) {
      if (iVar1 != 0xb) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Unknown namespace %s. Ignoring dialogue lump.\n",
                   (this->super_UDMFParserBase).sc.String);
        return false;
      }
      iVar4 = 2;
    }
    (this->super_UDMFParserBase).namespace_bits = iVar4;
    FScanner::MustGetToken((FScanner *)this,0x3b);
    do {
      while( true ) {
        bVar2 = FScanner::GetString((FScanner *)this);
        if (!bVar2) goto LAB_004608db;
        bVar3 = FScanner::Compare((FScanner *)this,"conversation");
        if (bVar3) break;
        bVar2 = FScanner::Compare((FScanner *)this,"include");
        if (bVar2) {
          FScanner::MustGetToken((FScanner *)this,0x3d);
          FScanner::MustGetToken((FScanner *)this,0x102);
          LoadScriptFile((this->super_UDMFParserBase).sc.String,true,0);
          FScanner::MustGetToken((FScanner *)this,0x3b);
        }
        else {
          UDMFParserBase::Skip(&this->super_UDMFParserBase);
        }
      }
      FScanner::MustGetToken((FScanner *)this,0x7b);
      bVar3 = ParseConversation(this);
    } while (bVar3);
LAB_004608db:
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
    FScanner::ScriptMessage((FScanner *)this,"Map does not define a namespace.\n");
  }
  return bVar2;
}

Assistant:

bool Parse(int lumpnum, FileReader *lump, int lumplen)
	{
		char *buffer = new char[lumplen];
		lump->Read(buffer, lumplen);
		sc.OpenMem(Wads.GetLumpFullName(lumpnum), buffer, lumplen);
		delete [] buffer;
		sc.SetCMode(true);
		// Namespace must be the first field because everything else depends on it.
		if (sc.CheckString("namespace"))
		{
			sc.MustGetToken('=');
			sc.MustGetToken(TK_StringConst);
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				break;
			case NAME_Strife:
				namespace_bits = St;
				break;
			default:
				sc.ScriptMessage("Unknown namespace %s. Ignoring dialogue lump.\n", sc.String);
				return false;
			}
			sc.MustGetToken(';');
		}
		else
		{
			sc.ScriptMessage("Map does not define a namespace.\n");
			return false;
		}

		while (sc.GetString())
		{
			if (sc.Compare("conversation"))
			{
				sc.MustGetToken('{');
				if (!ParseConversation()) return false;
			}
			else if (sc.Compare("include"))
			{
				sc.MustGetToken('=');
				sc.MustGetToken(TK_StringConst);
				LoadScriptFile(sc.String, true);
				sc.MustGetToken(';');
			}
			else
			{
				Skip();
			}
		}
		return true;
	}